

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompression.cpp
# Opt level: O0

void Imf_3_3::getCompressionDescriptionFromId(Compression id,string *desc)

{
  string *in_RSI;
  int in_EDI;
  undefined1 *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  string local_30 [32];
  string *local_10;
  
  local_10 = in_RSI;
  if ((in_EDI < 0) || (9 < in_EDI)) {
    std::__cxx11::string::operator=(in_RSI,"INVALID COMPRESSION ID");
  }
  __rhs = IdToDesc;
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &stack0xffffffffffffffb0;
  std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
  std::__cxx11::string::operator=(local_10,local_30);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  return;
}

Assistant:

void
getCompressionDescriptionFromId (Compression id, std::string& desc)
{
    if (id < NO_COMPRESSION || id >= NUM_COMPRESSION_METHODS)
        desc = UNKNOWN_COMPRESSION_ID_MSG;
    desc = IdToDesc[static_cast<int> (id)].name + ": " +
           IdToDesc[static_cast<int> (id)].desc;
}